

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  uVar1 = t->u;
  uVar2 = t->v;
  uVar3 = t->q;
  uVar4 = t->r;
  uVar9 = d->v[8] >> 0x1f;
  uVar5 = e->v[8] >> 0x1f;
  iVar10 = (uVar5 & uVar2) + (uVar9 & uVar1);
  iVar6 = (uVar5 & uVar4) + (uVar9 & uVar3);
  lVar12 = (long)e->v[0] * (long)(int)uVar2 + (long)d->v[0] * (long)(int)uVar1;
  lVar14 = (long)e->v[0] * (long)(int)uVar4 + (long)d->v[0] * (long)(int)uVar3;
  lVar13 = (long)(modinfo->modulus).v[0];
  lVar11 = (long)(int)(iVar10 - ((int)lVar12 * modinfo->modulus_inv30 + iVar10 & 0x3fffffff));
  lVar12 = lVar11 * lVar13 + lVar12;
  lVar7 = (long)(int)(iVar6 - ((int)lVar14 * modinfo->modulus_inv30 + iVar6 & 0x3fffffff));
  lVar14 = lVar13 * lVar7 + lVar14;
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 8) break;
    lVar8 = (long)(modinfo->modulus).v[lVar13 + 1];
    lVar12 = (long)d->v[lVar13 + 1] * (long)(int)uVar1 + (lVar12 >> 0x1e) +
             lVar8 * lVar11 + (long)e->v[lVar13 + 1] * (long)(int)uVar2;
    lVar14 = (long)d->v[lVar13 + 1] * (long)(int)uVar3 + (lVar14 >> 0x1e) +
             lVar8 * lVar7 + (long)e->v[lVar13 + 1] * (long)(int)uVar4;
    d->v[lVar13] = (uint)lVar12 & 0x3fffffff;
    e->v[lVar13] = (uint)lVar14 & 0x3fffffff;
    lVar13 = lVar13 + 1;
  }
  d->v[8] = (int32_t)(lVar12 >> 0x1e);
  e->v[8] = (int32_t)(lVar14 >> 0x1e);
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}